

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta,
          longdouble objective_amplifier)

{
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> *this_00;
  row_iterator prVar1;
  longdouble *__return_storage_ptr__;
  int r_size_00;
  longdouble lVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *x_00;
  bool bVar3;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar4;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar5;
  type prVar6;
  pointer begin;
  pointer prVar7;
  type piVar8;
  type prVar9;
  bit_array *x_01;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar10;
  longdouble lVar11;
  bool local_169;
  undefined1 auStack_e8 [7];
  bool pi_change;
  string_view local_d8;
  int local_c4;
  undefined1 auStack_c0 [4];
  int i_1;
  int local_ac;
  int local_a8;
  int selected;
  int i;
  int r_size;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_84;
  undefined1 auStack_80 [4];
  int k;
  bool local_69;
  undefined1 auStack_68 [7];
  bool at_least_one_pi_changed;
  longdouble objective_amplifier_local;
  longdouble theta_local;
  longdouble delta_local;
  longdouble kappa_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *last_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *first_local;
  bit_array *x_local;
  solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
  *this_local;
  
  stack0xffffffffffffffc8 = kappa;
  stack0xffffffffffffffb8 = delta;
  stack0xffffffffffffffa8 = theta;
  _auStack_68 = objective_amplifier;
  local_69 = false;
  lVar10 = in_ST3;
  lVar11 = in_ST3;
  unique0x10000438 = last;
  last_local = first;
  first_local = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *)x;
  x_local = (bit_array *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_80,
             "push-update-row {} {} {}\n");
  debug_logger<false>::log<long_double,long_double,long_double>
            ((debug_logger<false> *)this,_auStack_80,(longdouble *)((long)&delta_local + 8),
             (longdouble *)((long)&theta_local + 8),
             (longdouble *)((long)&objective_amplifier_local + 8));
  while( true ) {
    bVar3 = std::
            operator==<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      (first,last);
    if (((bVar3 ^ 0xffU) & 1) == 0) break;
    this_00 = &it.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
               .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)this_00,first);
    local_84 = constraint<std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                         ((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                           *)this_00);
    sparse_matrix<int>::row((sparse_matrix<int> *)&i,(int)this + 0x10);
    pprVar4 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar1 = *pprVar4;
    pprVar5 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
    ::decrease_preference
              ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                *)this,prVar1,*pprVar5,stack0xffffffffffffffa8);
    pprVar4 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    prVar1 = *pprVar4;
    pprVar5 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    x_01 = (bit_array *)first_local;
    selected = solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                           *)this,prVar1,*pprVar5,(bit_array *)first_local);
    for (local_a8 = 0; lVar2 = _auStack_68, local_a8 != selected; local_a8 = local_a8 + 1) {
      __return_storage_ptr__ = *(longdouble **)(this + 0x70);
      prVar6 = std::
               unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x58),(long)local_a8);
      quadratic_cost_type<long_double>::operator()
                (__return_storage_ptr__,(quadratic_cost_type<long_double> *)(ulong)(uint)prVar6->id,
                 (int)first_local,x_01);
      prVar6 = std::
               unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x58),(long)local_a8);
      prVar6->value = prVar6->value + lVar2 * in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = lVar10;
      lVar10 = lVar11;
    }
    begin = std::
            unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                   *)(this + 0x58));
    prVar7 = std::
             unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
             ::get((unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                    *)(this + 0x58));
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>
              (begin,prVar7 + selected,*(random_engine **)(this + 8));
    r_size_00 = selected;
    piVar8 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       ((unique_ptr<int[],_std::default_delete<int[]>_> *)(this + 0x60),
                        (long)local_84);
    local_ac = solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
               ::select_variables((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                                   *)this,r_size_00,*piVar8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c0,
               "constraints {}: {} = ");
    piVar8 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       ((unique_ptr<int[],_std::default_delete<int[]>_> *)(this + 0x60),
                        (long)local_84);
    debug_logger<false>::log<int,int>((debug_logger<false> *)this,_auStack_c0,&local_84,piVar8);
    for (local_c4 = 0; local_c4 < selected; local_c4 = local_c4 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"{} ({}) ")
      ;
      prVar6 = std::
               unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x58),(long)local_c4);
      prVar9 = std::
               unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             *)(this + 0x58),(long)local_c4);
      debug_logger<false>::log<long_double,int>
                ((debug_logger<false> *)this,local_d8,&prVar6->value,&prVar9->id);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8," => Selected: {}\n");
    debug_logger<false>::log<int>((debug_logger<false> *)this,_auStack_e8,&local_ac);
    x_00 = first_local;
    pprVar4 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&i);
    bVar3 = affect<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                      ((solver_equalities_01coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                        *)this,(bit_array *)x_00,*pprVar4,local_84,local_ac,selected,
                       stack0xffffffffffffffc8,stack0xffffffffffffffb8);
    local_169 = true;
    if ((local_69 & 1U) == 0) {
      local_169 = bVar3;
    }
    local_69 = local_169;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(first);
  }
  return (bool)(local_69 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }